

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_read_pcm_frames_within_range
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_bool32 mVar1;
  ma_result mVar2;
  undefined8 *in_RCX;
  ulong in_RDX;
  long *in_RDI;
  ma_uint64 rangeEnd;
  ma_uint64 rangeBeg;
  ma_uint64 absoluteCursor;
  ma_uint64 relativeCursor;
  ma_bool32 loop;
  ma_uint64 framesRead;
  ma_result result;
  ma_data_source_base *pDataSourceBase;
  ma_uint64 *in_stack_00000fb8;
  ma_uint64 in_stack_00000fc0;
  void *in_stack_00000fc8;
  ma_data_source *in_stack_00000fd0;
  ulong local_70;
  ulong local_68;
  ma_uint64 *in_stack_ffffffffffffffa0;
  ma_data_source *in_stack_ffffffffffffffa8;
  long local_50;
  ma_result local_34;
  ulong local_20;
  ma_result local_4;
  
  mVar1 = ma_data_source_is_looping(in_RDI);
  if (in_RDI == (long *)0x0) {
    local_4 = MA_AT_END;
  }
  else if (in_RDX == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    if (((*(uint *)(*in_RDI + 0x30) & 1) == 0) &&
       ((in_RDI[2] != -1 || ((in_RDI[4] != -1 && (mVar1 != 0)))))) {
      mVar2 = ma_data_source_get_cursor_in_pcm_frames
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (mVar2 == MA_SUCCESS) {
        local_70 = in_RDI[2];
        local_68 = local_70;
        if ((mVar1 != 0) && (in_RDI[4] != -1)) {
          if ((ulong)(in_RDI[1] + in_RDI[4]) <= local_70) {
            local_70 = in_RDI[1] + in_RDI[4];
          }
          local_68 = local_70;
        }
        local_20 = in_RDX;
        if ((local_68 - (in_RDI[1] + local_50) < in_RDX) && (local_68 != 0xffffffffffffffff)) {
          local_20 = local_68 - (in_RDI[1] + local_50);
        }
        if (local_20 == 0) {
          local_34 = MA_AT_END;
        }
        else {
          local_34 = ma_data_source_read_pcm_frames_from_backend
                               (in_stack_00000fd0,in_stack_00000fc8,in_stack_00000fc0,
                                in_stack_00000fb8);
        }
      }
      else {
        local_34 = ma_data_source_read_pcm_frames_from_backend
                             (in_stack_00000fd0,in_stack_00000fc8,in_stack_00000fc0,
                              in_stack_00000fb8);
      }
    }
    else {
      local_34 = ma_data_source_read_pcm_frames_from_backend
                           (in_stack_00000fd0,in_stack_00000fc8,in_stack_00000fc0,in_stack_00000fb8)
      ;
    }
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = 0;
    }
    if (local_34 == MA_SUCCESS) {
      local_34 = MA_AT_END;
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

static ma_result ma_data_source_read_pcm_frames_within_range(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_uint64 framesRead = 0;
    ma_bool32 loop = ma_data_source_is_looping(pDataSource);

    if (pDataSourceBase == NULL) {
        return MA_AT_END;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    if ((pDataSourceBase->vtable->flags & MA_DATA_SOURCE_SELF_MANAGED_RANGE_AND_LOOP_POINT) != 0 || (pDataSourceBase->rangeEndInFrames == ~((ma_uint64)0) && (pDataSourceBase->loopEndInFrames == ~((ma_uint64)0) || loop == MA_FALSE))) {
        /* Either the data source is self-managing the range, or no range is set - just read like normal. The data source itself will tell us when the end is reached. */
        result = ma_data_source_read_pcm_frames_from_backend(pDataSource, pFramesOut, frameCount, &framesRead);
    } else {
        /* Need to clamp to within the range. */
        ma_uint64 relativeCursor;
        ma_uint64 absoluteCursor;

        result = ma_data_source_get_cursor_in_pcm_frames(pDataSourceBase, &relativeCursor);
        if (result != MA_SUCCESS) {
            /* Failed to retrieve the cursor. Cannot read within a range or loop points. Just read like normal - this may happen for things like noise data sources where it doesn't really matter. */
            result = ma_data_source_read_pcm_frames_from_backend(pDataSource, pFramesOut, frameCount, &framesRead);
        } else {
            ma_uint64 rangeBeg;
            ma_uint64 rangeEnd;

            /* We have the cursor. We need to make sure we don't read beyond our range. */
            rangeBeg = pDataSourceBase->rangeBegInFrames;
            rangeEnd = pDataSourceBase->rangeEndInFrames;

            absoluteCursor = rangeBeg + relativeCursor;

            /* If looping, make sure we're within range. */
            if (loop) {
                if (pDataSourceBase->loopEndInFrames != ~((ma_uint64)0)) {
                    rangeEnd = ma_min(rangeEnd, pDataSourceBase->rangeBegInFrames + pDataSourceBase->loopEndInFrames);
                }
            }

            if (frameCount > (rangeEnd - absoluteCursor) && rangeEnd != ~((ma_uint64)0)) {
                frameCount = (rangeEnd - absoluteCursor);
            }

            /*
            If the cursor is sitting on the end of the range the frame count will be set to 0 which can
            result in MA_INVALID_ARGS. In this case, we don't want to try reading, but instead return
            MA_AT_END so the higher level function can know about it.
            */
            if (frameCount > 0) {
                result = ma_data_source_read_pcm_frames_from_backend(pDataSource, pFramesOut, frameCount, &framesRead);
            } else {
                result = MA_AT_END; /* The cursor is sitting on the end of the range which means we're at the end. */
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = framesRead;
    }

    /* We need to make sure MA_AT_END is returned if we hit the end of the range. */
    if (result == MA_SUCCESS && framesRead == 0) {
        result  = MA_AT_END;
    }

    return result;
}